

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int uv_tcp_open(uv_tcp_t *handle,uv_os_sock_t sock)

{
  int iVar1;
  int err;
  uv_os_sock_t sock_local;
  uv_tcp_t *handle_local;
  
  iVar1 = uv__fd_exists(handle->loop,sock);
  if (iVar1 == 0) {
    handle_local._4_4_ = uv__nonblock_ioctl(sock,1);
    if (handle_local._4_4_ == 0) {
      handle_local._4_4_ = uv__stream_open((uv_stream_t *)handle,sock,0xc000);
    }
  }
  else {
    handle_local._4_4_ = -0x11;
  }
  return handle_local._4_4_;
}

Assistant:

int uv_tcp_open(uv_tcp_t* handle, uv_os_sock_t sock) {
  int err;

  if (uv__fd_exists(handle->loop, sock))
    return UV_EEXIST;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  return uv__stream_open((uv_stream_t*)handle,
                         sock,
                         UV_HANDLE_READABLE | UV_HANDLE_WRITABLE);
}